

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_buffer_stream.h
# Opt level: O1

int __thiscall crnlib::buffer_stream::close(buffer_stream *this,int __fd)

{
  byte bVar1;
  undefined4 in_EAX;
  
  bVar1 = (this->super_data_stream).field_0x1a;
  if ((bVar1 & 1) != 0) {
    (this->super_data_stream).field_0x1a = bVar1 & 0xfe;
    this->m_pBuf = (uint8 *)0x0;
    this->m_size = 0;
    this->m_ofs = 0;
  }
  return CONCAT31((int3)((uint)in_EAX >> 8),bVar1) & 0xffffff01;
}

Assistant:

virtual bool close()
        {
            if (m_opened)
            {
                m_opened = false;
                m_pBuf = nullptr;
                m_size = 0;
                m_ofs = 0;
                return true;
            }

            return false;
        }